

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void __thiscall icu_63::Hashtable::Hashtable(Hashtable *this,UBool ignoreKeyCase,UErrorCode *status)

{
  code *local_30;
  UErrorCode *status_local;
  UBool ignoreKeyCase_local;
  Hashtable *this_local;
  
  this->hash = (UHashtable *)0x0;
  if (ignoreKeyCase == '\0') {
    local_30 = uhash_hashUnicodeString_63;
  }
  else {
    local_30 = uhash_hashCaselessUnicodeString_63;
  }
  init(this,(EVP_PKEY_CTX *)local_30);
  return;
}

Assistant:

inline Hashtable::Hashtable(UBool ignoreKeyCase, UErrorCode& status)
 : hash(0)
{
    init(ignoreKeyCase ? uhash_hashCaselessUnicodeString
                        : uhash_hashUnicodeString,
            ignoreKeyCase ? uhash_compareCaselessUnicodeString
                        : uhash_compareUnicodeString,
            NULL,
            status);
}